

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

float_specs
fmt::v6::internal::parse_float_type_spec<fmt::v6::internal::error_handler,char>
          (basic_format_specs<char> *specs,error_handler *eh)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  
  bVar2 = (byte)specs->field_0x9 >> 7;
  uVar3 = (uint)bVar2 << 0x15;
  uVar4 = (uint)bVar2 << 0x15;
  bVar1 = specs->type;
  if (bVar1 < 0x61) {
    switch(bVar1) {
    case 0x41:
      uVar4 = uVar3 | 0x10000;
LAB_0011da8d:
      uVar4 = uVar4 | 3;
      break;
    case 0x42:
    case 0x43:
    case 0x44:
switchD_0011da47_caseD_42:
      error_handler::on_error(eh,"invalid type specifier");
    case 0x45:
      uVar3 = 0x10000;
switchD_0011da69_caseD_65:
      uVar4 = (uVar3 & 0x1ffffe) + (uint)(specs->precision != 0 | bVar2) * 0x200000 + 1;
      break;
    case 0x46:
      uVar3 = 0x10000;
switchD_0011da69_caseD_66:
      uVar4 = (uVar3 & 0x1ffffd) + (uint)(specs->precision != 0 | bVar2) * 0x200000 + 2;
      break;
    case 0x47:
      uVar4 = uVar3 | 0x10000;
      break;
    default:
      if (bVar1 != 0) goto switchD_0011da47_caseD_42;
      uVar4 = (uint)(specs->precision != 0 | bVar2) << 0x15;
    }
  }
  else {
    switch(bVar1) {
    case 0x65:
      goto switchD_0011da69_caseD_65;
    case 0x66:
      goto switchD_0011da69_caseD_66;
    case 0x67:
      break;
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
      goto switchD_0011da47_caseD_42;
    case 0x6e:
      uVar4 = uVar3 | 0x20000;
      break;
    default:
      if (bVar1 != 0x61) goto switchD_0011da47_caseD_42;
      goto LAB_0011da8d;
    }
  }
  return (float_specs)((ulong)uVar4 << 0x20);
}

Assistant:

FMT_CONSTEXPR float_specs parse_float_type_spec(
    const basic_format_specs<Char>& specs, ErrorHandler&& eh = {}) {
  auto result = float_specs();
  result.trailing_zeros = specs.alt;
  switch (specs.type) {
  case 0:
    result.format = float_format::general;
    result.trailing_zeros |= specs.precision != 0;
    break;
  case 'G':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'g':
    result.format = float_format::general;
    break;
  case 'E':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'e':
    result.format = float_format::exp;
    result.trailing_zeros |= specs.precision != 0;
    break;
  case 'F':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'f':
    result.format = float_format::fixed;
    result.trailing_zeros |= specs.precision != 0;
    break;
#if FMT_DEPRECATED_PERCENT
  case '%':
    result.format = float_format::fixed;
    result.percent = true;
    break;
#endif
  case 'A':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'a':
    result.format = float_format::hex;
    break;
  case 'n':
    result.locale = true;
    break;
  default:
    eh.on_error("invalid type specifier");
    break;
  }
  return result;
}